

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_set_attributes(coda_type *type,coda_type_record *attributes)

{
  undefined8 uVar1;
  char *message;
  
  if (type == (coda_type *)0x0) {
    message = "type argument is NULL (%s:%u)";
    uVar1 = 0x3d2;
  }
  else if (attributes == (coda_type_record *)0x0) {
    message = "attributes argument is NULL (%s:%u)";
    uVar1 = 0x3d7;
  }
  else {
    if (type->attributes == (coda_type_record *)0x0) {
      type->attributes = attributes;
      attributes->retain_count = attributes->retain_count + 1;
      return 0;
    }
    message = "attributes are already set (%s:%u)";
    uVar1 = 0x3dc;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar1);
  return -1;
}

Assistant:

int coda_type_set_attributes(coda_type *type, coda_type_record *attributes)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (attributes == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attributes argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->attributes != NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attributes are already set (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    type->attributes = attributes;
    attributes->retain_count++;
    return 0;
}